

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libhoard.cpp
# Opt level: O0

void * xxmemalign(size_t alignment,size_t sz)

{
  void *pvVar1;
  size_t in_RSI;
  size_t in_RDI;
  
  pvVar1 = generic_xxmemalign(in_RDI,in_RSI);
  return pvVar1;
}

Assistant:

void * xxmemalign (size_t alignment, size_t sz) {
#else
  void * xxmemalign (size_t alignment, size_t sz) {
#endif
    return generic_xxmemalign(alignment, sz);
  }
    
  size_t xxmalloc_usable_size (void * ptr) {
    return getCustomHeap()->getSize (ptr);
  }

  void xxmalloc_lock() {
    // Undefined for Hoard.
  }

  void xxmalloc_unlock() {
    // Undefined for Hoard.
  }

}